

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidgetPrivate::resetRenderTargetObjects(QRhiWidgetPrivate *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x2e8) != 0) {
    QRhiResource::deleteLater();
    *(undefined8 *)(in_RDI + 0x2e8) = 0;
  }
  if (*(long *)(in_RDI + 0x2f0) != 0) {
    QRhiResource::deleteLater();
    *(undefined8 *)(in_RDI + 0x2f0) = 0;
  }
  if (*(long *)(in_RDI + 0x2e0) != 0) {
    QRhiResource::deleteLater();
    *(undefined8 *)(in_RDI + 0x2e0) = 0;
  }
  return;
}

Assistant:

void QRhiWidgetPrivate::resetRenderTargetObjects()
{
    if (renderTarget) {
        renderTarget->deleteLater();
        renderTarget = nullptr;
    }
    if (renderPassDescriptor) {
        renderPassDescriptor->deleteLater();
        renderPassDescriptor = nullptr;
    }
    if (depthStencilBuffer) {
        depthStencilBuffer->deleteLater();
        depthStencilBuffer = nullptr;
    }
}